

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O2

void Gia_ManFromBridgeCex(FILE *pFile,Abc_Cex_t *pCex)

{
  uint uVar1;
  Vec_Str_t *p;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  p = Vec_StrAlloc((int)pFile);
  Vec_StrPush(p,'\x02');
  Vec_StrPush(p,'\x01');
  Gia_AigerWriteUnsigned(p,pCex->iPo);
  Vec_StrPush(p,'\x01');
  Gia_AigerWriteUnsigned(p,pCex->iFrame);
  Gia_AigerWriteUnsigned(p,1);
  Gia_AigerWriteUnsigned(p,pCex->iFrame + 1);
  uVar3 = pCex->nRegs;
  for (iVar2 = 0; iVar2 <= pCex->iFrame; iVar2 = iVar2 + 1) {
    Gia_AigerWriteUnsigned(p,pCex->nPis);
    for (iVar4 = 0; uVar1 = uVar3 + iVar4, iVar4 < pCex->nPis; iVar4 = iVar4 + 1) {
      Vec_StrPush(p,(((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0) + '\x02');
    }
    uVar3 = uVar1;
  }
  if (uVar3 == pCex->nBits) {
    Vec_StrPush(p,'\x01');
    Gia_AigerWriteUnsigned(p,pCex->nRegs);
    for (iVar2 = 0; iVar2 < pCex->nRegs; iVar2 = iVar2 + 1) {
      Vec_StrPush(p,'\x02');
    }
    Gia_CreateHeader(pFile,0x65,p->nSize,(uchar *)p->pArray);
    Vec_StrFree(p);
    fflush((FILE *)pFile);
    return;
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilBridge.c"
                ,0x114,"void Gia_ManFromBridgeCex(FILE *, Abc_Cex_t *)");
}

Assistant:

void Gia_ManFromBridgeCex( FILE * pFile, Abc_Cex_t * pCex )
{
    int i, f, iBit;//, RetValue;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_StrPush( vStr, (char)BRIDGE_VALUE_0 ); // false
    Vec_StrPush( vStr, (char)1 ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsigned( vStr, pCex->iPo ); // number of the property (Armin's encoding)
    Vec_StrPush( vStr, (char)1 ); // size of vector (Armin's encoding)
    Gia_AigerWriteUnsigned( vStr, pCex->iFrame ); // depth

    Gia_AigerWriteUnsigned( vStr, 1 ); // concrete
    Gia_AigerWriteUnsigned( vStr, pCex->iFrame + 1 ); // number of frames (1 more than depth)
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        Gia_AigerWriteUnsigned( vStr, pCex->nPis ); // num of inputs
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            Vec_StrPush( vStr, (char)(Abc_InfoHasBit(pCex->pData, iBit) ? BRIDGE_VALUE_1:BRIDGE_VALUE_0) ); // value
    }
    assert( iBit == pCex->nBits );
    Vec_StrPush( vStr, (char)1 ); // the number of frames (for a concrete counter-example)
    Gia_AigerWriteUnsigned( vStr, pCex->nRegs ); // num of flops
    for ( i = 0; i < pCex->nRegs; i++ )
        Vec_StrPush( vStr, (char)BRIDGE_VALUE_0 ); // always zero!!!
//    RetValue = fwrite( Vec_StrArray(vStr), Vec_StrSize(vStr), 1, pFile );
    Gia_CreateHeader(pFile, 101/*type=Result*/, Vec_StrSize(vStr), (unsigned char*)Vec_StrArray(vStr));

    Vec_StrFree( vStr );
    fflush(pFile);
}